

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_range.c
# Opt level: O0

CURLcode Curl_range(Curl_easy *data)

{
  CURLofft CVar1;
  CURLofft CVar2;
  bool bVar3;
  curl_off_t totalsize;
  CURLofft to_t;
  CURLofft from_t;
  char *ptr2;
  char *ptr;
  curl_off_t to;
  curl_off_t from;
  Curl_easy *data_local;
  
  if (((*(uint *)&(data->state).field_0x744 >> 8 & 1) == 0) || ((data->state).range == (char *)0x0))
  {
    (data->req).maxdownload = -1;
  }
  else {
    from = (curl_off_t)data;
    CVar1 = curlx_strtoofft((data->state).range,&ptr2,10,&to);
    if (CVar1 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    while( true ) {
      bVar3 = false;
      if (((*ptr2 != '\0') && (bVar3 = true, *ptr2 != ' ')) && (bVar3 = true, *ptr2 != '\t')) {
        bVar3 = *ptr2 == '-';
      }
      if (!bVar3) break;
      ptr2 = ptr2 + 1;
    }
    CVar2 = curlx_strtoofft(ptr2,(char **)&to_t,10,(curl_off_t *)&ptr);
    if (CVar2 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    if ((CVar2 == CURL_OFFT_INVAL) && (CVar1 == CURL_OFFT_OK)) {
      *(curl_off_t *)(from + 0x1198) = to;
    }
    else if ((CVar1 == CURL_OFFT_INVAL) && (CVar2 == CURL_OFFT_OK)) {
      *(char **)(from + 0xf8) = ptr;
      *(long *)(from + 0x1198) = -(long)ptr;
    }
    else {
      if ((long)ptr < to) {
        return CURLE_RANGE_ERROR;
      }
      if ((long)ptr - to == 0x7fffffffffffffff) {
        return CURLE_RANGE_ERROR;
      }
      *(long *)(from + 0xf8) = ((long)ptr - to) + 1;
      *(curl_off_t *)(from + 0x1198) = to;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_range(struct Curl_easy *data)
{
  curl_off_t from, to;
  char *ptr;
  char *ptr2;

  if(data->state.use_range && data->state.range) {
    CURLofft from_t;
    CURLofft to_t;
    from_t = curlx_strtoofft(data->state.range, &ptr, 10, &from);
    if(from_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    while(*ptr && (ISBLANK(*ptr) || (*ptr == '-')))
      ptr++;
    to_t = curlx_strtoofft(ptr, &ptr2, 10, &to);
    if(to_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    if((to_t == CURL_OFFT_INVAL) && !from_t) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE %" FMT_OFF_T " to end of file", from));
    }
    else if((from_t == CURL_OFFT_INVAL) && !to_t) {
      /* -Y */
      data->req.maxdownload = to;
      data->state.resume_from = -to;
      DEBUGF(infof(data, "RANGE the last %" FMT_OFF_T " bytes", to));
    }
    else {
      /* X-Y */
      curl_off_t totalsize;

      /* Ensure the range is sensible - to should follow from. */
      if(from > to)
        return CURLE_RANGE_ERROR;

      totalsize = to - from;
      if(totalsize == CURL_OFF_T_MAX)
        return CURLE_RANGE_ERROR;

      data->req.maxdownload = totalsize + 1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE from %" FMT_OFF_T
                   " getting %" FMT_OFF_T " bytes",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(data, "range-download from %" FMT_OFF_T
                 " to %" FMT_OFF_T ", totally %" FMT_OFF_T " bytes",
                 from, to, data->req.maxdownload));
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}